

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.cpp
# Opt level: O0

double hedg::Timing::time_diff_mins(string *t1,string *t2)

{
  undefined8 uVar1;
  time_t __time0;
  double dVar2;
  time_t second_time;
  tm time2;
  time_t first_time;
  tm time1;
  float sec2;
  float sec;
  int min2;
  int hour2;
  int day2;
  int month2;
  int year2;
  int min;
  int hour;
  int day;
  int month;
  int year;
  string *t2_local;
  string *t1_local;
  
  _month = t2;
  t2_local = t1;
  uVar1 = std::__cxx11::string::c_str();
  __isoc99_sscanf(uVar1,"%d-%d-%dT%d:%d:%fZ",&day,&hour,&min,&year2,&month2,
                  (undefined1 *)((long)&time1.tm_zone + 4));
  uVar1 = std::__cxx11::string::c_str();
  __isoc99_sscanf(uVar1,"%d-%d-%dT%d:%d:%fZ",&day2,&hour2,&min2,&sec,&sec2,&time1.tm_zone);
  memset(&first_time,0,0x38);
  time1.tm_mday = day + -0x76c;
  time1.tm_hour = hour + 1;
  time1.tm_min = min;
  time1.tm_sec = year2;
  first_time._4_4_ = month2;
  first_time._0_4_ = (int)time1.tm_zone._4_4_;
  time2.tm_zone = (char *)mktime((tm *)&first_time);
  memset(&second_time,0,0x38);
  time2.tm_mday = day + -0x76c;
  time2.tm_hour = hour2 + 1;
  time2.tm_min = min2;
  time2.tm_sec = (int)sec;
  second_time._4_4_ = sec2;
  second_time._0_4_ = (int)time1.tm_zone._4_4_;
  __time0 = mktime((tm *)&second_time);
  dVar2 = difftime((time_t)time2.tm_zone,__time0);
  return dVar2 / 60.0;
}

Assistant:

double Timing::time_diff_mins(std::string t1, std::string t2) {
	int year, month, day, hour, min;
	int year2, month2, day2, hour2, min2;
	float sec, sec2;
	sscanf(t1.c_str(), "%d-%d-%dT%d:%d:%fZ", &year, &month, &day, &hour, &min, &sec);
	sscanf(t2.c_str(), "%d-%d-%dT%d:%d:%fZ", &year2, &month2, &day2, &hour2, &min2, &sec2);

	tm time1 = { 0 };
	time1.tm_year = year - 1900;
	time1.tm_mon = month + 1;
	time1.tm_mday = day;
	time1.tm_hour = hour;
	time1.tm_min = min;
	time1.tm_sec = (int)sec;
	time_t first_time = std::mktime(&time1);

	tm time2 = { 0 };
	time2.tm_year = year - 1900;
	time2.tm_mon = month2 + 1;
	time2.tm_mday = day2;
	time2.tm_hour = hour2;
	time2.tm_min = min2;
	time2.tm_sec = (int)sec;
	time_t second_time = std::mktime(&time2);

	return std::difftime(first_time, second_time) / 60;

}